

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O1

void printXOPCC(MCInst *MI,uint Op,SStream *O)

{
  MCOperand *op;
  int64_t iVar1;
  char *s;
  int v;
  ulong uVar2;
  
  op = MCInst_getOperand(MI,Op);
  iVar1 = MCOperand_getImm(op);
  uVar2 = iVar1 - 1;
  if (uVar2 < 7) {
    s = &DAT_00498b74 + *(int *)(&DAT_00498b74 + uVar2 * 4);
    v = (int)uVar2 + 2;
  }
  else {
    v = 1;
    s = "lt";
  }
  SStream_concat0(O,s);
  op_addXopCC(MI,v);
  return;
}

Assistant:

static void printXOPCC(MCInst *MI, unsigned Op, SStream *O)
{
	int64_t Imm = MCOperand_getImm(MCInst_getOperand(MI, Op));

	switch (Imm) {
		default: // llvm_unreachable("Invalid xopcc argument!");
		case 0: SStream_concat0(O, "lt"); op_addXopCC(MI, X86_XOP_CC_LT); break;
		case 1: SStream_concat0(O, "le"); op_addXopCC(MI, X86_XOP_CC_LE); break;
		case 2: SStream_concat0(O, "gt"); op_addXopCC(MI, X86_XOP_CC_GT); break;
		case 3: SStream_concat0(O, "ge"); op_addXopCC(MI, X86_XOP_CC_GE); break;
		case 4: SStream_concat0(O, "eq"); op_addXopCC(MI, X86_XOP_CC_EQ); break;
		case 5: SStream_concat0(O, "neq"); op_addXopCC(MI, X86_XOP_CC_NEQ); break;
		case 6: SStream_concat0(O, "false"); op_addXopCC(MI, X86_XOP_CC_FALSE); break;
		case 7: SStream_concat0(O, "true"); op_addXopCC(MI, X86_XOP_CC_TRUE); break;
	}
}